

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::FreeZeroObjVariablePS::FreeZeroObjVariablePS
          (FreeZeroObjVariablePS *this,SPxLPBase<double> *lp,int _j,bool loFree,
          DSVectorBase<double> *col_idx_sorted,shared_ptr<soplex::Tolerances> *tols)

{
  double *pdVar1;
  pointer pdVar2;
  double dVar3;
  element_type *peVar4;
  Nonzero<double> *pNVar5;
  VectorBase<double> *pVVar6;
  VectorBase<double> *pVVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  undefined4 uVar13;
  uint uVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar4 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  iVar8 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar11 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006ab348;
  (this->super_PostStep).m_name = "FreeZeroObjVariable";
  (this->super_PostStep).nCols = iVar11;
  (this->super_PostStep).nRows = iVar8;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeZeroObjVariablePS_006ab950;
  this->m_j = _j;
  this->m_old_j = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  this->m_old_i = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  pVVar6 = &(lp->super_LPColSetBase<double>).low;
  if (loFree) {
    pVVar6 = &(lp->super_LPColSetBase<double>).up;
  }
  this->m_bnd = (pVVar6->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[_j];
  DSVectorBase<double>::DSVectorBase(&this->m_col,col_idx_sorted);
  iVar8 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
          [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx].data.
          super_SVectorBase<double>.memused;
  (this->m_lRhs).super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  (this->m_lRhs).super_SVectorBase<double>.memsize = 0;
  (this->m_lRhs).super_SVectorBase<double>.memused = 0;
  (this->m_lRhs)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
  (this->m_lRhs).theelem = (Nonzero<double> *)0x0;
  if (iVar8 < 1) {
    iVar8 = 2;
  }
  spx_alloc<soplex::Nonzero<double>*>(&(this->m_lRhs).theelem,iVar8);
  (this->m_lRhs).super_SVectorBase<double>.m_elem = (this->m_lRhs).theelem;
  (this->m_lRhs).super_SVectorBase<double>.memused = 0;
  (this->m_lRhs).super_SVectorBase<double>.memsize = iVar8;
  iVar8 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
          [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx].data.
          super_SVectorBase<double>.memused;
  (this->m_rowObj).super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  (this->m_rowObj).super_SVectorBase<double>.memsize = 0;
  (this->m_rowObj).super_SVectorBase<double>.memused = 0;
  (this->m_rowObj)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006aae80;
  (this->m_rowObj).theelem = (Nonzero<double> *)0x0;
  iVar11 = 2;
  if (0 < iVar8) {
    iVar11 = iVar8;
  }
  spx_alloc<soplex::Nonzero<double>*>(&(this->m_rowObj).theelem,iVar11);
  (this->m_rowObj).super_SVectorBase<double>.m_elem = (this->m_rowObj).theelem;
  (this->m_rowObj).super_SVectorBase<double>.memused = 0;
  (this->m_rowObj).super_SVectorBase<double>.memsize = iVar11;
  Array<soplex::DSVectorBase<double>_>::Array
            (&this->m_rows,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx].data.
             super_SVectorBase<double>.memused);
  this->m_loFree = loFree;
  if (0 < (this->m_col).super_SVectorBase<double>.memused) {
    pVVar6 = &(lp->super_LPRowSetBase<double>).right;
    lVar9 = 0;
    lVar12 = 0;
    lVar10 = 0;
    do {
      pNVar5 = (this->m_col).super_SVectorBase<double>.m_elem;
      pVVar7 = pVVar6;
      if (this->m_loFree == true) {
        if (*(double *)((long)&pNVar5->val + lVar12) <= 0.0) {
LAB_001fa8fb:
          pVVar7 = &(lp->super_LPRowSetBase<double>).left;
        }
      }
      else {
        pdVar1 = (double *)((long)&pNVar5->val + lVar12);
        if (0.0 < *pdVar1 || *pdVar1 == 0.0) goto LAB_001fa8fb;
      }
      iVar8 = *(int *)((long)&pNVar5->idx + lVar12);
      DSVectorBase<double>::add
                (&this->m_lRhs,(int)lVar10,
                 (pVVar7->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar8);
      DSVectorBase<double>::operator=
                ((DSVectorBase<double> *)
                 ((long)&((this->m_rows).data.
                          super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_vptr_DSVectorBase + lVar9),
                 (SVectorBase<double> *)
                 ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[iVar8].idx));
      if (lp->thesense == MINIMIZE) {
        pdVar2 = (lp->super_LPRowSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + iVar8;
        uVar13 = *(undefined4 *)pdVar2;
        uVar14 = *(uint *)((long)pdVar2 + 4) ^ 0x80000000;
      }
      else {
        dVar3 = (lp->super_LPRowSetBase<double>).object.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar8];
        uVar13 = SUB84(dVar3,0);
        uVar14 = (uint)((ulong)dVar3 >> 0x20);
      }
      DSVectorBase<double>::makeMem(&this->m_rowObj,1);
      dVar3 = (double)CONCAT44(uVar14,uVar13);
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        iVar8 = (this->m_rowObj).super_SVectorBase<double>.memused;
        pNVar5 = (this->m_rowObj).super_SVectorBase<double>.m_elem;
        pNVar5[iVar8].idx = (int)lVar10;
        pNVar5[iVar8].val = dVar3;
        (this->m_rowObj).super_SVectorBase<double>.memused = iVar8 + 1;
      }
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0x10;
      lVar9 = lVar9 + 0x20;
    } while (lVar10 < (this->m_col).super_SVectorBase<double>.memused);
  }
  return;
}

Assistant:

FreeZeroObjVariablePS(const SPxLPBase<R>& lp, int _j, bool loFree,
                            DSVectorBase<R> col_idx_sorted, std::shared_ptr<Tolerances> tols)
         : PostStep("FreeZeroObjVariable", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_bnd(loFree ? lp.upper(_j) : lp.lower(_j))
         , m_col(col_idx_sorted)
         , m_lRhs(lp.colVector(_j).size())
         , m_rowObj(lp.colVector(_j).size())
         , m_rows(lp.colVector(_j).size())
         , m_loFree(loFree)
      {
         for(int k = 0; k < m_col.size(); ++k)
         {
            int r = m_col.index(k);

            if((m_loFree  && m_col.value(k) > 0) ||
                  (!m_loFree && m_col.value(k) < 0))
               m_lRhs.add(k, lp.rhs(r));
            else
               m_lRhs.add(k, lp.lhs(r));

            m_rows[k] = lp.rowVector(r);
            m_rowObj.add(k, lp.rowObj(r));
         }
      }